

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

int Spl_ManFindOne(Spl_Man_t *p)

{
  int *piVar1;
  Vec_Wec_t *pVVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  uint uVar11;
  Gia_Man_t *pGVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  pVVar9 = p->vNodes;
  uVar11 = pVVar9->nSize;
  if (0 < (int)uVar11) {
    pGVar12 = p->pGia;
    pVVar2 = pGVar12->vMapping2;
    piVar3 = pVVar9->pArray;
    lVar13 = 0;
    do {
      lVar14 = (long)piVar3[lVar13];
      if ((lVar14 < 0) || (pVVar2->nSize <= piVar3[lVar13])) goto LAB_007dd786;
      pVVar4 = pVVar2->pArray;
      if (pVVar4 == (Vec_Int_t *)0x0) break;
      if (0 < pVVar4[lVar14].nSize) {
        piVar5 = pGVar12->pLutRefs;
        if (piVar5 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x25d,"int Gia_ObjLutRefDecId(Gia_Man_t *, int)");
        }
        piVar6 = pVVar4[lVar14].pArray;
        lVar15 = 0;
        do {
          piVar1 = piVar5 + piVar6[lVar15];
          *piVar1 = *piVar1 + -1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar4[lVar14].nSize);
        uVar11 = pVVar9->nSize;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (int)uVar11);
  }
  if (0 < (int)uVar11 && ((uVar11 & 1) != 0 && p->fReverse != 0)) {
    pGVar12 = p->pGia;
    lVar13 = 0;
    do {
      if (pGVar12->pLutRefs == (int *)0x0) goto LAB_007dd7a5;
      iVar8 = pVVar9->pArray[lVar13];
      uVar11 = pGVar12->pLutRefs[iVar8];
      if (uVar11 != 0) {
        if ((int)uVar11 < 1) {
          __assert_fail("Gia_ObjLutRefNumId(p->pGia, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                        ,0x162,"int Spl_ManFindOne(Spl_Man_t *)");
        }
        if (uVar11 < 5) {
          iVar7 = Spl_ManLutFanouts(pGVar12,iVar8,p->vFanouts,p->vMarksNo,p->vMarksCIO);
          pGVar12 = p->pGia;
          if (pGVar12->pLutRefs == (int *)0x0) goto LAB_007dd7a5;
          if ((pGVar12->pLutRefs[iVar8] == 1) && (iVar7 == 1)) goto LAB_007dd6cc;
          pVVar9 = p->vNodes;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
  }
  p->vCands->nSize = 0;
  p->vInputs->nSize = 0;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      lVar14 = (long)pVVar9->pArray[lVar13];
      if ((lVar14 < 0) || (pVVar2 = p->pGia->vMapping2, pVVar2->nSize <= pVVar9->pArray[lVar13]))
      goto LAB_007dd786;
      pVVar4 = pVVar2->pArray;
      if (pVVar4 == (Vec_Int_t *)0x0) break;
      iVar8 = pVVar4[lVar14].nSize;
      if (0 < iVar8) {
        lVar15 = 0;
        do {
          uVar11 = pVVar4[lVar14].pArray[lVar15];
          if (((int)uVar11 < 0) || (p->vMarksNo->nSize <= (int)uVar11)) goto LAB_007dd767;
          if (((uint)p->vMarksNo->pArray[uVar11 >> 5] >> (uVar11 & 0x1f) & 1) == 0) {
            if (p->vMarksCIO->nSize <= (int)uVar11) goto LAB_007dd767;
            if ((p->vMarksCIO->pArray[uVar11 >> 5] & 1 << ((byte)uVar11 & 0x1f)) == 0) {
              piVar3 = p->pGia->pLutRefs;
              if (piVar3 == (int *)0x0) goto LAB_007dd7a5;
              if (piVar3[uVar11] == 0) {
                Vec_IntPush(p->vCands,uVar11);
                Vec_IntPush(p->vInputs,uVar11);
                iVar8 = pVVar4[lVar14].nSize;
              }
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < iVar8);
        pVVar9 = p->vNodes;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
  }
  iVar8 = Spl_ManFindGoodCand(p);
  if (iVar8 != 0) goto LAB_007dd6e0;
  p->vCands->nSize = 0;
  p->vInputs->nSize = 0;
  pVVar9 = p->vNodes;
  uVar10 = (ulong)(uint)pVVar9->nSize;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      iVar8 = (int)uVar10;
      lVar14 = (long)pVVar9->pArray[lVar13];
      if ((lVar14 < 0) || (pVVar2 = p->pGia->vMapping2, pVVar2->nSize <= pVVar9->pArray[lVar13]))
      goto LAB_007dd786;
      pVVar4 = pVVar2->pArray;
      if (pVVar4 == (Vec_Int_t *)0x0) break;
      iVar8 = pVVar4[lVar14].nSize;
      if (0 < iVar8) {
        lVar15 = 0;
        do {
          uVar11 = pVVar4[lVar14].pArray[lVar15];
          if (((int)uVar11 < 0) || (p->vMarksNo->nSize <= (int)uVar11)) goto LAB_007dd767;
          if (((uint)p->vMarksNo->pArray[uVar11 >> 5] >> (uVar11 & 0x1f) & 1) == 0) {
            if (p->vMarksCIO->nSize <= (int)uVar11) {
LAB_007dd767:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if ((p->vMarksCIO->pArray[uVar11 >> 5] & 1 << ((byte)uVar11 & 0x1f)) == 0) {
              Vec_IntPush(p->vCands,uVar11);
              Vec_IntPush(p->vInputs,uVar11);
              iVar8 = pVVar4[lVar14].nSize;
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < iVar8);
        pVVar9 = p->vNodes;
      }
      lVar13 = lVar13 + 1;
      iVar8 = pVVar9->nSize;
      uVar10 = (ulong)iVar8;
    } while (lVar13 < (long)uVar10);
    if (0 < iVar8) {
      lVar13 = 0;
      do {
        piVar3 = p->pGia->pLutRefs;
        if (piVar3 == (int *)0x0) {
LAB_007dd7a5:
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x25b,"int Gia_ObjLutRefNumId(Gia_Man_t *, int)");
        }
        iVar8 = pVVar9->pArray[lVar13];
        uVar11 = piVar3[iVar8];
        if (uVar11 != 0) {
          if ((int)uVar11 < 1) {
            __assert_fail("Gia_ObjLutRefNumId(p->pGia, iObj) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                          ,0x18d,"int Spl_ManFindOne(Spl_Man_t *)");
          }
          if (uVar11 < 5) {
            iVar7 = Spl_ManLutFanouts(p->pGia,iVar8,p->vFanouts,p->vMarksNo,p->vMarksCIO);
            piVar3 = p->pGia->pLutRefs;
            if (piVar3 == (int *)0x0) goto LAB_007dd7a5;
            if ((piVar3[iVar8] == 1) && (iVar7 == 1)) goto LAB_007dd6cc;
            pVVar9 = p->vFanouts;
            if (0 < pVVar9->nSize) {
              pVVar4 = p->vCands;
              lVar14 = 0;
              do {
                Vec_IntPush(pVVar4,pVVar9->pArray[lVar14]);
                lVar14 = lVar14 + 1;
              } while (lVar14 < pVVar9->nSize);
            }
          }
        }
        lVar13 = lVar13 + 1;
        pVVar9 = p->vNodes;
      } while (lVar13 < pVVar9->nSize);
    }
  }
  iVar8 = Spl_ManFindGoodCand(p);
  if (iVar8 != 0) goto LAB_007dd6e0;
  pVVar9 = p->vCands;
  if (pVVar9->nSize < 1) {
    iVar8 = 0;
    goto LAB_007dd6e0;
  }
LAB_007dd6da:
  iVar8 = *pVVar9->pArray;
LAB_007dd6e0:
  pVVar9 = p->vNodes;
  iVar7 = pVVar9->nSize;
  if (0 < iVar7) {
    pGVar12 = p->pGia;
    pVVar2 = pGVar12->vMapping2;
    piVar3 = pVVar9->pArray;
    lVar13 = 0;
    do {
      lVar14 = (long)piVar3[lVar13];
      if ((lVar14 < 0) || (pVVar2->nSize <= piVar3[lVar13])) {
LAB_007dd786:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar4 = pVVar2->pArray;
      if (pVVar4 == (Vec_Int_t *)0x0) {
        return iVar8;
      }
      if (0 < pVVar4[lVar14].nSize) {
        piVar5 = pGVar12->pLutRefs;
        if (piVar5 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x25c,"int Gia_ObjLutRefIncId(Gia_Man_t *, int)");
        }
        piVar6 = pVVar4[lVar14].pArray;
        lVar15 = 0;
        do {
          piVar1 = piVar5 + piVar6[lVar15];
          *piVar1 = *piVar1 + 1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar4[lVar14].nSize);
        iVar7 = pVVar9->nSize;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar7);
  }
  return iVar8;
LAB_007dd6cc:
  pVVar9 = p->vFanouts;
  if (pVVar9->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  goto LAB_007dd6da;
}

Assistant:

int Spl_ManFindOne( Spl_Man_t * p )
{
    Vec_Int_t * vVec;
    int nFanouts, iObj, iFan, i, k;
    int Res = 0; 

    // deref
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefDecId( p->pGia, iFan );

    // collect external nodes
    if ( p->fReverse && (Vec_IntSize(p->vNodes) & 1) )
    {
        Vec_IntForEachEntry( p->vNodes, iObj, i )
        {
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 0 )
                continue;
            assert( Gia_ObjLutRefNumId(p->pGia, iObj) > 0 );
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) >= 5 )  // skip nodes with high fanout!
                continue;
            nFanouts = Spl_ManLutFanouts( p->pGia, iObj, p->vFanouts, p->vMarksNo, p->vMarksCIO );
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 1 && nFanouts == 1 )
            {
                Res = Vec_IntEntry(p->vFanouts, 0);
                goto finish;
            }
            //Vec_IntAppend( p->vCands, p->vFanouts );
        }
    }

    // consider LUT inputs - get one that has no refs
    Vec_IntClear( p->vCands );
    Vec_IntClear( p->vInputs );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) && !Vec_BitEntry(p->vMarksCIO, iFan) && !Gia_ObjLutRefNumId(p->pGia, iFan) )
            {
                Vec_IntPush( p->vCands, iFan );
                Vec_IntPush( p->vInputs, iFan );
            }
    Res = Spl_ManFindGoodCand( p );
    if ( Res )
        goto finish;

    // collect candidates
    Vec_IntClear( p->vCands );
    Vec_IntClear( p->vInputs );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) && !Vec_BitEntry(p->vMarksCIO, iFan) )
            {
                Vec_IntPush( p->vCands, iFan );
                Vec_IntPush( p->vInputs, iFan );
            }

    // all inputs have refs - collect external nodes
    Vec_IntForEachEntry( p->vNodes, iObj, i )
    {
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 0 )
            continue;
        assert( Gia_ObjLutRefNumId(p->pGia, iObj) > 0 );
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) >= 5 )  // skip nodes with high fanout!
            continue;
        nFanouts = Spl_ManLutFanouts( p->pGia, iObj, p->vFanouts, p->vMarksNo, p->vMarksCIO );
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 1 && nFanouts == 1 )
        {
            Res = Vec_IntEntry(p->vFanouts, 0);
            goto finish;
        }
        Vec_IntAppend( p->vCands, p->vFanouts );
    }

    // choose among not-so-good ones
    Res = Spl_ManFindGoodCand( p );
    if ( Res )
        goto finish;

    // get the first candidate
    if ( Res == 0 && Vec_IntSize(p->vCands) > 0 )
        Res = Vec_IntEntry( p->vCands, 0 );

finish:
    // ref
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefIncId( p->pGia, iFan );
    return Res;
}